

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O2

int __thiscall
event_track::gen_avail_files
          (event_track *this,uint32_t track_duration,uint32_t seg_duration_ticks_ms,
          uint32_t avail_duration,uint32_t avail_interval,uint64_t start_time)

{
  uchar *puVar1;
  ostream *poVar2;
  int iVar3;
  pointer pDVar4;
  undefined4 in_register_00000084;
  uint64_t pt_off_start;
  uint64_t uVar5;
  ulong pt_off_end;
  vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  events;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dec;
  string base64_mes;
  string out_file_cmfm;
  string out_file_mpd;
  ofstream ot;
  char local_1b0 [64];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_170 [13];
  
  pt_off_start = CONCAT44(in_register_00000084,avail_interval);
  events.
  super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  events.
  super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  events.
  super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out_file_cmfm,"out_avail_track.cmfm",(allocator<char> *)&ot);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out_file_mpd,"out_avail_track.mpd",(allocator<char> *)&ot);
  pt_off_end = ((ulong)this & 0xffffffff) + pt_off_start;
  iVar3 = 0;
  for (uVar5 = pt_off_start; uVar5 < pt_off_end; uVar5 = uVar5 + avail_duration) {
    DASHEventMessageBoxv1::DASHEventMessageBoxv1((DASHEventMessageBoxv1 *)&ot);
    std::__cxx11::string::assign(local_1b0);
    fmp4_stream::gen_splice_insert(local_170,iVar3,seg_duration_ticks_ms * 0x5a,false);
    std::
    vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
    ::push_back(&events,(DASHEventMessageBoxv1 *)&ot);
    DASHEventMessageBoxv1::~DASHEventMessageBoxv1((DASHEventMessageBoxv1 *)&ot);
    iVar3 = iVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ot,"test_urn",(allocator<char> *)&base64_mes);
  write_to_segmented_event_track_file
            (&out_file_cmfm,&events,99,pt_off_start,pt_off_end,(string *)start_time,
             (ulong)track_duration,1000);
  std::__cxx11::string::~string((string *)&ot);
  poVar2 = std::operator<<((ostream *)&std::cout,"wrote event track ");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"generating the MPD");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ofstream::ofstream(&ot,"out_avail_track.mpd",_S_out);
  poVar2 = std::operator<<((ostream *)&ot,"<EventStream ");
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar3 = std::__cxx11::string::compare
                    ((char *)&(events.
                               super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                               ._M_impl.super__Vector_impl_data._M_start)->scheme_id_uri_);
  if (iVar3 == 0) {
    poVar2 = std::operator<<((ostream *)&ot,"schemeIdUri=");
    poVar2 = std::operator<<(poVar2,'\"');
    poVar2 = std::operator<<(poVar2,"urn:scte:scte35:2014:xml+bin");
  }
  else {
    poVar2 = std::operator<<((ostream *)&ot,"schemeIdUri=");
    poVar2 = std::operator<<(poVar2,'\"');
    poVar2 = std::operator<<(poVar2,(string *)
                                    &(events.
                                      super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->scheme_id_uri_);
  }
  poVar2 = std::operator<<(poVar2,'\"');
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&ot," timescale=");
  poVar2 = std::operator<<(poVar2,'\"');
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,'\"');
  poVar2 = std::operator<<(poVar2,">");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (pDVar4 = events.
                super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pDVar4 != events.
                super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                ._M_impl.super__Vector_impl_data._M_finish; pDVar4 = pDVar4 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout," writing an event to output ");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&ot,"<Event ");
    poVar2 = std::operator<<(poVar2,"presentationTime=");
    poVar2 = std::operator<<(poVar2,'\"');
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,'\"');
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,"duration=");
    poVar2 = std::operator<<(poVar2,'\"');
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,'\"');
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,"id=");
    poVar2 = std::operator<<(poVar2,'\"');
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,'\"');
    iVar3 = std::__cxx11::string::compare((char *)&pDVar4->scheme_id_uri_);
    if (iVar3 == 0) {
      puVar1 = (pDVar4->message_data_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      base64_encode_abi_cxx11_
                (&base64_mes,puVar1,
                 (ulong)(uint)(*(int *)&(pDVar4->message_data_).
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (int)puVar1));
      base64_decode(&dec,&base64_mes);
      poVar2 = std::operator<<((ostream *)&std::cout,"base64 of cue: ");
      poVar2 = std::operator<<(poVar2,(string *)&base64_mes);
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<((ostream *)&ot,'>');
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"  <Signal xmlns=");
      poVar2 = std::operator<<(poVar2,'\"');
      poVar2 = std::operator<<(poVar2,"http://www.scte.org/schemas/35/2016");
      poVar2 = std::operator<<(poVar2,'\"');
      poVar2 = std::operator<<(poVar2,'>');
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"    <Binary>");
      poVar2 = std::operator<<(poVar2,(string *)&base64_mes);
      poVar2 = std::operator<<(poVar2,"</Binary>");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"  </Signal>");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&dec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    else {
      poVar2 = std::operator<<((ostream *)&ot," ");
      poVar2 = std::operator<<(poVar2,"contentEncoding=");
      poVar2 = std::operator<<(poVar2,'\"');
      poVar2 = std::operator<<(poVar2,"base64");
      poVar2 = std::operator<<(poVar2,'\"');
      poVar2 = std::operator<<(poVar2,'>');
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      puVar1 = (pDVar4->message_data_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      base64_encode_abi_cxx11_
                (&base64_mes,puVar1,
                 (ulong)(uint)(*(int *)&(pDVar4->message_data_).
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (int)puVar1));
      poVar2 = std::operator<<(poVar2,(string *)&base64_mes);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::__cxx11::string::~string((string *)&base64_mes);
    poVar2 = std::operator<<((ostream *)&ot,"</Event>");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  poVar2 = std::operator<<((ostream *)&ot,"</EventStream> ");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ofstream::close();
  std::ofstream::~ofstream(&ot);
  std::__cxx11::string::~string((string *)&out_file_mpd);
  std::__cxx11::string::~string((string *)&out_file_cmfm);
  std::
  vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>::
  ~vector(&events);
  return 0;
}

Assistant:

int event_track::gen_avail_files(uint32_t track_duration, 
	uint32_t seg_duration_ticks_ms, 
	uint32_t avail_duration, 
	uint32_t avail_interval, 
	uint64_t start_time)
{
	std::vector<event_track::DASHEventMessageBoxv1> events;

	std::string out_file_cmfm = "out_avail_track.cmfm";
	std::string out_file_mpd = "out_avail_track.mpd";

	uint32_t timescale = 1000;
	uint32_t track_id = 99; // default track_id

	uint32_t id_count = 0;

	uint64_t track_duration_2 = start_time + track_duration;
	uint64_t st_2 = start_time;

	while (st_2 < track_duration_2)
	{
		event_track::DASHEventMessageBoxv1 ev;
		ev.id_ = id_count++;
		ev.presentation_time_ = st_2;
		ev.event_duration_ = avail_duration;
		ev.timescale_ = timescale;
		ev.scheme_id_uri_ = "urn:scte:scte35:2013:bin";
		fmp4_stream::gen_splice_insert(ev.message_data_, ev.id_, ev.event_duration_ * 90, false);
		st_2 += avail_interval;
		events.push_back(ev);
	}

	event_track::write_to_segmented_event_track_file(
		out_file_cmfm, events,
		track_id, start_time,
		track_duration + start_time, "test_urn",
		seg_duration_ticks_ms, timescale);

	std::cout << "wrote event track " << std::endl;


	std::cout << "generating the MPD" << std::endl;
	std::ofstream ot = std::ofstream("out_avail_track.mpd");
	ot << "<EventStream " << std::endl;
	if (events[0].scheme_id_uri_.compare("urn:scte:scte35:2013:bin") == 0) // convert binary scte 214 to xml + bin
	{
		ot << "schemeIdUri=" << '"' << "urn:scte:scte35:2014:xml+bin" << '"' << std::endl;
	}
	else {
		ot << "schemeIdUri=" << '"' << events[0].scheme_id_uri_ << '"' << std::endl;
	}
	ot << " timescale=" << '"' << timescale << '"' << ">" << std::endl;

	// write each of the event messages as moof mdat combinations in sparse track 
	for (auto it2 = events.begin(); it2 != events.end(); it2++)
	{
		std::cout << " writing an event to output " << std::endl;
		ot << "<Event "
			<< "presentationTime=" << '"' << it2->presentation_time_ << '"' << " "  \
			<< "duration=" << '"' << it2->event_duration_ << '"' << " "  \
			<< "id=" << '"' << it2->id_ << '"';
		if (it2->scheme_id_uri_.compare("urn:scte:scte35:2013:bin") == 0) // write binary scte as xml + bin as defined by scte-35
		{ 
			
			std::string base64_mes = base64_encode(it2->message_data_.data(), (unsigned int)it2->message_data_.size());
			std::vector<uint8_t> dec = base64_decode(base64_mes);
			std::cout << "base64 of cue: " << base64_mes << std::endl;
			ot << '>' << std::endl << "  <Signal xmlns=" << '"' << "http://www.scte.org/schemas/35/2016" << '"' << '>' << std::endl \
				<< "    <Binary>" << base64_mes << "</Binary>" << std::endl
				<< "  </Signal>" << std::endl;
		}
		else {
			ot << " " << "contentEncoding=" << '"' << "base64" << '"' << '>' << std::endl
				<< base64_encode(it2->message_data_.data(), (unsigned int)it2->message_data_.size()) << std::endl;
		}
		ot << "</Event>" << std::endl;
	}

	ot << "</EventStream> " << std::endl;
	ot.close();

	return 0;
}